

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::BiasLayerParams::_internal_add_shape(BiasLayerParams *this,uint64_t value)

{
  uint64_t local_18;
  uint64_t value_local;
  BiasLayerParams *this_local;
  
  local_18 = value;
  value_local = (uint64_t)this;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->shape_,&local_18);
  return;
}

Assistant:

inline void BiasLayerParams::_internal_add_shape(uint64_t value) {
  shape_.Add(value);
}